

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

void __thiscall ON_SubDMeshImpl::SealEdges(ON_SubDMeshImpl *this)

{
  ON_SubDLimitMeshSealEdgeInfo *pOVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  byte bVar5;
  uint grid_side_dex;
  uint grid_side_dex_00;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> fe_list;
  ON_SubDLimitMeshSealEdgeInfo local_58;
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> local_40;
  
  local_40._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081a228;
  local_40.m_a = (ON_SubDLimitMeshSealEdgeInfo *)0x0;
  local_40.m_count = 0;
  local_40.m_capacity = 0;
  if ((ulong)this->m_fragment_count != 0) {
    ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::SetCapacity
              (&local_40,(ulong)this->m_fragment_count);
  }
  local_58.m_edge_id = 0;
  local_58.m_bits = '\0';
  local_58.m_grid_side_dex = '\0';
  local_58.m_face_edge_count = 0;
  local_58.m_fragment = this->m_first_fragment;
  if (local_58.m_fragment != (ON_SubDMeshFragment *)0x0) {
    do {
      if ((local_58.m_fragment)->m_face != (ON_SubDFace *)0x0) {
        grid_side_dex_00 = 0;
        do {
          bVar4 = ON_SubDLimitMeshSealEdgeInfo::SetEdge(&local_58,grid_side_dex_00);
          if (bVar4) {
            ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::Append(&local_40,&local_58);
          }
          grid_side_dex_00 = grid_side_dex_00 + 1;
        } while (grid_side_dex_00 != 4);
      }
      local_58.m_fragment = (local_58.m_fragment)->m_next_fragment;
    } while (local_58.m_fragment != (ON_SubDMeshFragment *)0x0);
  }
  if (local_40.m_a != (ON_SubDLimitMeshSealEdgeInfo *)0x0) {
    if (1 < (long)local_40.m_count) {
      ON_qsort(local_40.m_a,(long)local_40.m_count,0x10,
               ON_SubDLimitMeshSealEdgeInfo::CompareEdgeIdBitsFaceId);
    }
  }
  iVar3 = local_40.m_count;
  uVar7 = local_40._16_8_ & 0xffffffff;
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      uVar8 = uVar8 & 0xffffffff;
      pOVar1 = local_40.m_a + uVar8;
      local_58.m_edge_id = pOVar1->m_edge_id;
      local_58.m_bits = pOVar1->m_bits;
      local_58.m_grid_side_dex = pOVar1->m_grid_side_dex;
      local_58.m_face_edge_count = pOVar1->m_face_edge_count;
      local_58.m_fragment = pOVar1->m_fragment;
      uVar2 = local_58._0_8_ & 0xc000000000;
      bVar5 = local_58.m_bits & 0xc0;
      lVar6 = uVar8 * 0x10;
      while( true ) {
        uVar8 = uVar8 + 1;
        if (uVar7 <= uVar8) goto LAB_0060992b;
        if ((local_58.m_edge_id != *(uint *)((long)&local_40.m_a[1].m_edge_id + lVar6)) ||
           ((uVar2 != 0 && (((&local_40.m_a[1].m_bits)[lVar6] & bVar5) == 0)))) break;
        ON_SubDLimitMeshSealEdgeInfo::Seal
                  (&local_58,
                   (ON_SubDLimitMeshSealEdgeInfo *)((long)&local_40.m_a[1].m_edge_id + lVar6));
        lVar6 = lVar6 + 0x10;
      }
    } while ((uint)uVar8 < (uint)iVar3);
  }
LAB_0060992b:
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::~ON_SimpleArray(&local_40);
  return;
}

Assistant:

void ON_SubDMeshImpl::SealEdges()
{
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> fe_list(m_fragment_count);
  ON_SubDLimitMeshSealEdgeInfo fe;
  for (fe.m_fragment = m_first_fragment; nullptr != fe.m_fragment; fe.m_fragment = fe.m_fragment->m_next_fragment)
  {
    if (nullptr == fe.m_fragment->m_face)
      continue;
    for (unsigned int grid_side_dex = 0; grid_side_dex < 4; grid_side_dex++)
    {
      if ( fe.SetEdge(grid_side_dex) )
        fe_list.Append(fe);
    }
  }

  fe_list.QuickSort(ON_SubDLimitMeshSealEdgeInfo::CompareEdgeIdBitsFaceId);
  const unsigned int fe_list_count = fe_list.UnsignedCount();
  unsigned int i0 = 0;
  while ( i0 < fe_list_count )
  {
    fe = fe_list[i0];
    const unsigned char src_half_mask = (fe.m_bits & ON_SubDLimitMeshSealEdgeInfo::Bits::HalfMask);
    for ( i0++; i0 < fe_list_count && fe.m_edge_id == fe_list[i0].m_edge_id; i0++ )
    {
      if (0 != src_half_mask && 0 == (src_half_mask & fe_list[i0].m_bits))
        break; // necessary when all faces attached to an edge are not quads.
      ON_SubDLimitMeshSealEdgeInfo::Seal(fe, fe_list[i0]);
    }
  }
}